

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::MultiPartOutputFile::Data::overrideSharedAttributesValues
          (Data *this,Header *src,Header *dst)

{
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *attribute;
  TypedAttribute<float> *attribute_00;
  TypedAttribute<Imf_3_4::TimeCode> *attribute_01;
  TypedAttribute<Imf_3_4::Chromaticities> *attribute_02;
  
  attribute = Header::
              findTypedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>>
                        (src,"displayWindow");
  if (attribute == (TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *)0x0) {
    Header::erase(dst,"displayWindow");
  }
  else {
    Header::insert(dst,"displayWindow",&attribute->super_Attribute);
  }
  attribute_00 = Header::findTypedAttribute<Imf_3_4::TypedAttribute<float>>(src,"pixelAspectRatio");
  if (attribute_00 == (TypedAttribute<float> *)0x0) {
    Header::erase(dst,"pixelAspectRatio");
  }
  else {
    Header::insert(dst,"pixelAspectRatio",&attribute_00->super_Attribute);
  }
  attribute_01 = Header::findTypedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>>
                           (src,"timecode");
  if (attribute_01 == (TypedAttribute<Imf_3_4::TimeCode> *)0x0) {
    Header::erase(dst,"timecode");
  }
  else {
    Header::insert(dst,"timecode",&attribute_01->super_Attribute);
  }
  attribute_02 = Header::findTypedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>>
                           (src,"chromaticities");
  if (attribute_02 != (TypedAttribute<Imf_3_4::Chromaticities> *)0x0) {
    Header::insert(dst,"chromaticities",&attribute_02->super_Attribute);
    return;
  }
  Header::erase(dst,"chromaticities");
  return;
}

Assistant:

void
MultiPartOutputFile::Data::overrideSharedAttributesValues (
    const Header& src, Header& dst)
{
    //
    // Display Window
    //
    const Box2iAttribute* displayWindow =
        src.findTypedAttribute<Box2iAttribute> ("displayWindow");

    if (displayWindow)
        dst.insert ("displayWindow", *displayWindow);
    else
        dst.erase ("displayWindow");

    //
    // Pixel Aspect Ratio
    //
    const FloatAttribute* pixelAspectRatio =
        src.findTypedAttribute<FloatAttribute> ("pixelAspectRatio");

    if (pixelAspectRatio)
        dst.insert ("pixelAspectRatio", *pixelAspectRatio);
    else
        dst.erase ("pixelAspectRatio");

    //
    // Timecode
    //
    const TimeCodeAttribute* timeCode =
        src.findTypedAttribute<TimeCodeAttribute> ("timecode");

    if (timeCode)
        dst.insert ("timecode", *timeCode);
    else
        dst.erase ("timecode");

    //
    // Chromaticities
    //
    const ChromaticitiesAttribute* chromaticities =
        src.findTypedAttribute<ChromaticitiesAttribute> ("chromaticities");

    if (chromaticities)
        dst.insert ("chromaticities", *chromaticities);
    else
        dst.erase ("chromaticities");
}